

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall IfStatement::print(IfStatement *this)

{
  ExprNode *pEVar1;
  int i;
  int iVar2;
  IfStatement *pIVar3;
  
  std::operator<<((ostream *)&std::cout,"if ");
  (**this->_cond->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout,":");
  Statements::print(this->_stmts);
  pIVar3 = this;
  while (pIVar3 = pIVar3->_elif, pIVar3 != (IfStatement *)0x0) {
    pEVar1 = pIVar3->_cond;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if (pEVar1 == (ExprNode *)0x0) {
      for (iVar2 = 0; iVar2 < (this->super_Statement).indentState; iVar2 = iVar2 + 1) {
        std::operator<<((ostream *)&std::cout," ");
      }
      std::operator<<((ostream *)&std::cout,"else");
    }
    else {
      for (iVar2 = 0; iVar2 < (this->super_Statement).indentState; iVar2 = iVar2 + 1) {
        std::operator<<((ostream *)&std::cout," ");
      }
      std::operator<<((ostream *)&std::cout,"elif ");
      (**pIVar3->_cond->_vptr_ExprNode)();
    }
    std::operator<<((ostream *)&std::cout,":");
    Statements::print(pIVar3->_stmts);
  }
  return;
}

Assistant:

void IfStatement::print() {
    //std::cout << "Printing If Statement...\n";
    std::cout << "if "; _cond->print(); std::cout << ":";
    _stmts->print();
    IfStatement* next = _elif;
    while(next != nullptr) {
        if (next->_cond == nullptr){
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "else";
        } else {
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "elif "; next->_cond->print();
        }
        std::cout << ":";
        next->_stmts->print();
        next = next->_elif;
    }
//    std::vector<std::pair<ExprNode*,Statements*>>testsAndSuites = getTestsAndSuites();
//    for(int i = 0; i < testsAndSuites.size();i++){
//        if(i == 0) {
//            std::cout << "if ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else if( testsAndSuites[i].first == nullptr) {
//            std::cout << "else ";
//            std::cout << " : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else{
//            std::cout << "elif ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//    }
}